

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O3

void * __thiscall
Diligent::DynamicLinearAllocator::Allocate(DynamicLinearAllocator *this,size_t size,size_t align)

{
  pointer pBVar1;
  uint8_t *puVar2;
  DynamicLinearAllocator *this_00;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  undefined4 extraout_var;
  uint8_t *puVar6;
  char (*in_R8) [23];
  char (*Args_2) [23];
  pointer pBVar7;
  string msg;
  size_t local_68;
  string local_60;
  DynamicLinearAllocator *local_40;
  ulong local_38;
  
  if (size == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pBVar7 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = this;
    if (pBVar7 != pBVar1) {
      uVar4 = align - (align >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      do {
        puVar2 = pBVar7->CurrPtr;
        local_68 = align;
        if ((char)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) != '\x01'
           ) {
          FormatString<char[12],unsigned_long,char[23]>
                    (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_68,
                     (unsigned_long *)") must be a power of 2",in_R8);
          DebugAssertionFailed
                    (local_60._M_dataplus._M_p,"AlignUp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                     ,0x34);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        pvVar5 = (void *)(-local_68 & (ulong)(puVar2 + (local_68 - 1)));
        puVar2 = (uint8_t *)((long)pvVar5 + size);
        if (puVar2 <= pBVar7->Data + pBVar7->Size) {
          pBVar7->CurrPtr = puVar2;
          return pvVar5;
        }
        pBVar7 = pBVar7 + 1;
      } while (pBVar7 != pBVar1);
    }
    this_00 = local_40;
    uVar4 = (ulong)local_40->m_BlockSize;
    do {
      local_38 = uVar4;
      uVar4 = local_38 * 2;
    } while (local_38 < (size + align) - 1);
    Args_2 = (char (*) [23])0x6a;
    iVar3 = (**local_40->m_pAllocator->_vptr_IMemoryAllocator)
                      (local_40->m_pAllocator,local_38,"dynamic linear allocator page",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                      );
    local_60._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
    std::
    vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
    ::emplace_back<void*,unsigned_long&>
              ((vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
                *)this_00,(void **)&local_60,&local_38);
    pBVar7 = (this_00->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = pBVar7[-1].Data;
    puVar6 = puVar2;
    local_68 = align;
    if ((align ^ align - 1) <= align - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_68,
                 (unsigned_long *)") must be a power of 2",Args_2);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      puVar6 = pBVar7[-1].Data;
    }
    pvVar5 = (void *)(-local_68 & (ulong)(puVar2 + (local_68 - 1)));
    if (puVar6 + pBVar7[-1].Size < (uint8_t *)(size + (long)pvVar5)) {
      FormatString<char[50]>
                (&local_60,(char (*) [50])"Not enough space in the new block - this is a bug");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                 ,0x6e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    pBVar7[-1].CurrPtr = (uint8_t *)(size + (long)pvVar5);
  }
  return pvVar5;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t align)
    {
        if (size == 0)
            return nullptr;

        for (auto& block : m_Blocks)
        {
            auto* Ptr = AlignUp(block.CurrPtr, align);
            if (Ptr + size <= block.Data + block.Size)
            {
                block.CurrPtr = Ptr + size;
                return Ptr;
            }
        }

        // Create a new block
        size_t BlockSize = m_BlockSize;
        while (BlockSize < size + align - 1)
            BlockSize *= 2;
        m_Blocks.emplace_back(m_pAllocator->Allocate(BlockSize, "dynamic linear allocator page", __FILE__, __LINE__), BlockSize);

        auto& block = m_Blocks.back();
        auto* Ptr   = AlignUp(block.Data, align);
        VERIFY(Ptr + size <= block.Data + block.Size, "Not enough space in the new block - this is a bug");
        block.CurrPtr = Ptr + size;
        return Ptr;
    }